

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  pointer piVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  uint *puVar12;
  long lVar13;
  uint *puVar14;
  uint *puVar15;
  long lVar16;
  uint *puVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsObjectiveFunction_cpp:106:13)>
  __cmp;
  _DistanceType __len;
  
  puVar1 = (uint *)(end._M_current + -1);
  do {
    lVar8 = (long)end._M_current - (long)begin._M_current;
    uVar18 = lVar8 >> 2;
    if ((long)uVar18 < 0x18) {
      if ((leftmost & 1U) == 0) {
        bVar20 = true;
        if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
          piVar6 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar12 = (uint *)(begin._M_current + 1);
          _Var10._M_current = begin._M_current;
          do {
            puVar14 = puVar12;
            uVar2 = ((uint *)_Var10._M_current)[1];
            uVar18 = (ulong)uVar2;
            uVar3 = *_Var10._M_current;
            if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
               (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
                ((uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
                 ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
              do {
                do {
                  puVar12 = (uint *)_Var10._M_current;
                  puVar12[1] = *puVar12;
                  uVar3 = puVar12[-1];
                  _Var10._M_current = (int *)(puVar12 + -1);
                } while ((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]);
              } while (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3]) &&
                      ((uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
                       ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)));
              *puVar12 = uVar2;
            }
            puVar12 = puVar14 + 1;
            _Var10._M_current = (int *)puVar14;
          } while (puVar12 != (uint *)end._M_current);
          goto LAB_002d4fdf;
        }
      }
      else {
        bVar20 = true;
        if ((begin._M_current != end._M_current) &&
           (puVar12 = (uint *)(begin._M_current + 1), puVar12 != (uint *)end._M_current)) {
          piVar6 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar8 = 0;
          _Var10._M_current = begin._M_current;
          do {
            uVar2 = *puVar12;
            uVar18 = (ulong)uVar2;
            uVar3 = *_Var10._M_current;
            if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
               (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
                ((uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
                 ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
              puVar14 = puVar12 + -1;
              *puVar12 = uVar3;
              if (puVar14 != (uint *)begin._M_current) {
                lVar13 = 0;
                do {
                  uVar3 = *(uint *)((long)_Var10._M_current + lVar13 + -4);
                  if (((uint)piVar6[(int)uVar3] <= (uint)piVar6[(int)uVar2]) &&
                     (((uint)piVar6[(int)uVar3] < (uint)piVar6[(int)uVar2] ||
                      (((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <=
                       (uVar18 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       uVar18 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) break;
                  *(uint *)((long)_Var10._M_current + lVar13) = uVar3;
                  lVar13 = lVar13 + -4;
                } while (lVar8 != lVar13);
                puVar14 = (uint *)(lVar13 + (long)_Var10._M_current);
              }
              *puVar14 = uVar2;
            }
            puVar12 = puVar12 + 1;
            _Var10._M_current = _Var10._M_current + 1;
            lVar8 = lVar8 + -4;
          } while (puVar12 != (uint *)end._M_current);
LAB_002d4fdf:
          bVar20 = true;
        }
      }
    }
    else {
      uVar9 = uVar18 >> 1;
      if ((long)uVar18 < 0x81) {
        uVar2 = *begin._M_current;
        uVar3 = begin._M_current[uVar9];
        piVar6 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9] = uVar2;
          *begin._M_current = uVar3;
        }
        uVar2 = end._M_current[-1];
        uVar3 = *begin._M_current;
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          *begin._M_current = uVar2;
          end._M_current[-1] = uVar3;
        }
        uVar2 = *begin._M_current;
        uVar3 = begin._M_current[uVar9];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9] = uVar2;
          *begin._M_current = uVar3;
        }
      }
      else {
        uVar2 = begin._M_current[uVar9];
        uVar3 = *begin._M_current;
        piVar6 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          *begin._M_current = uVar2;
          begin._M_current[uVar9] = uVar3;
        }
        uVar2 = end._M_current[-1];
        uVar3 = begin._M_current[uVar9];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9] = uVar2;
          end._M_current[-1] = uVar3;
        }
        uVar2 = begin._M_current[uVar9];
        uVar3 = *begin._M_current;
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          *begin._M_current = uVar2;
          begin._M_current[uVar9] = uVar3;
        }
        uVar2 = begin._M_current[uVar9 - 1];
        uVar3 = begin._M_current[1];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[1] = uVar2;
          begin._M_current[uVar9 - 1] = uVar3;
        }
        uVar2 = end._M_current[-2];
        uVar3 = begin._M_current[uVar9 - 1];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9 - 1] = uVar2;
          end._M_current[-2] = uVar3;
        }
        uVar2 = begin._M_current[uVar9 - 1];
        uVar3 = begin._M_current[1];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[1] = uVar2;
          begin._M_current[uVar9 - 1] = uVar3;
        }
        uVar2 = begin._M_current[uVar9 + 1];
        uVar3 = begin._M_current[2];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[2] = uVar2;
          begin._M_current[uVar9 + 1] = uVar3;
        }
        uVar2 = end._M_current[-3];
        uVar3 = begin._M_current[uVar9 + 1];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9 + 1] = uVar2;
          end._M_current[-3] = uVar3;
        }
        uVar2 = begin._M_current[uVar9 + 1];
        uVar3 = begin._M_current[2];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[2] = uVar2;
          begin._M_current[uVar9 + 1] = uVar3;
        }
        uVar2 = begin._M_current[uVar9];
        uVar3 = begin._M_current[uVar9 - 1];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9 - 1] = uVar2;
          begin._M_current[uVar9] = uVar3;
        }
        uVar2 = begin._M_current[uVar9 + 1];
        uVar3 = begin._M_current[uVar9];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9] = uVar2;
          begin._M_current[uVar9 + 1] = uVar3;
        }
        uVar2 = begin._M_current[uVar9];
        uVar3 = begin._M_current[uVar9 - 1];
        if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
           (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
            (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar9 - 1] = uVar2;
          begin._M_current[uVar9] = uVar3;
        }
        iVar4 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar9];
        begin._M_current[uVar9] = iVar4;
      }
      if ((leftmost & 1U) == 0) {
        uVar2 = begin._M_current[-1];
        uVar3 = *begin._M_current;
        piVar6 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar5 = piVar6[(int)uVar3];
        if ((uVar5 <= (uint)piVar6[(int)uVar2]) &&
           ((uVar9 = (ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                     (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20,
            uVar5 < (uint)piVar6[(int)uVar2] ||
            (uVar9 <= ((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                      (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          lVar8 = 0;
          while( true ) {
            uVar2 = *(uint *)((long)puVar1 + lVar8);
            if (((uint)piVar6[(int)uVar2] <= uVar5) &&
               (((uint)piVar6[(int)uVar2] < uVar5 ||
                (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <= uVar9))))
            break;
            lVar8 = lVar8 + -4;
          }
          puVar12 = (uint *)((long)puVar1 + lVar8);
          if (lVar8 == 0) {
            puVar14 = (uint *)(begin._M_current + 1);
            while (puVar17 = puVar14 + -1, puVar14 + -1 < puVar12) {
              uVar2 = *puVar14;
              puVar17 = puVar14;
              if ((uVar5 < (uint)piVar6[(int)uVar2]) ||
                 ((puVar14 = puVar14 + 1, uVar5 <= (uint)piVar6[(int)uVar2] &&
                  (uVar9 < ((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                           (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)))))
              break;
            }
          }
          else {
            puVar14 = (uint *)(begin._M_current + 1);
            do {
              puVar17 = puVar14;
              uVar2 = *puVar17;
              if (uVar5 < (uint)piVar6[(int)uVar2]) break;
              puVar14 = puVar17 + 1;
            } while (((uint)piVar6[(int)uVar2] < uVar5) ||
                    (((ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                     (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <= uVar9));
          }
LAB_002d59a8:
          if (puVar17 < puVar12) {
            uVar2 = *puVar17;
            *puVar17 = *puVar12;
            *puVar12 = uVar2;
            uVar2 = piVar6[(int)uVar3];
            do {
              do {
                puVar12 = puVar12 + -1;
                uVar5 = *puVar12;
              } while (uVar2 < (uint)piVar6[(int)uVar5]);
            } while ((uVar2 <= (uint)piVar6[(int)uVar5]) &&
                    (uVar9 < ((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                             (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)));
            puVar14 = puVar17 + 1;
            do {
              puVar17 = puVar14;
              uVar5 = *puVar17;
              if (uVar2 < (uint)piVar6[(int)uVar5]) break;
              puVar14 = puVar17 + 1;
            } while (((uint)piVar6[(int)uVar5] < uVar2) ||
                    (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                     (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <= uVar9));
            goto LAB_002d59a8;
          }
          *begin._M_current = *puVar12;
          *puVar12 = uVar3;
          begin._M_current = (int *)(puVar12 + 1);
          bVar20 = false;
          goto LAB_002d59ca;
        }
      }
      uVar2 = *begin._M_current;
      piVar6 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = piVar6[(int)uVar2];
      uVar9 = (ulong)uVar2 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
              (ulong)uVar2 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20;
      lVar13 = 0;
      _Var10._M_current = begin._M_current;
      while( true ) {
        puVar12 = (uint *)_Var10._M_current + 1;
        uVar5 = *puVar12;
        if ((uVar3 <= (uint)piVar6[(int)uVar5]) &&
           ((uVar3 < (uint)piVar6[(int)uVar5] ||
            (uVar9 <= ((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                      (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) break;
        lVar13 = lVar13 + -4;
        _Var10._M_current = (int *)puVar12;
      }
      puVar14 = puVar1;
      if (lVar13 == 0) {
        while (puVar17 = puVar14 + 1, puVar12 < puVar14 + 1) {
          uVar5 = *puVar14;
          puVar17 = puVar14;
          if (((uint)piVar6[(int)uVar5] < uVar3) ||
             ((puVar14 = puVar14 + -1, (uint)piVar6[(int)uVar5] <= uVar3 &&
              (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
               (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) < uVar9)))) break;
        }
      }
      else {
        do {
          puVar17 = puVar14;
          uVar5 = *puVar17;
          if ((uint)piVar6[(int)uVar5] < uVar3) break;
          puVar14 = puVar17 + -1;
        } while ((uVar3 < (uint)piVar6[(int)uVar5]) ||
                (uVar9 <= ((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                          (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)));
      }
      puVar14 = puVar12;
      puVar15 = puVar17;
      if (puVar12 < puVar17) {
        do {
          uVar3 = *puVar14;
          *puVar14 = *puVar15;
          *puVar15 = uVar3;
          uVar3 = piVar6[(int)uVar2];
          do {
            do {
              _Var10._M_current = (int *)puVar14;
              puVar14 = (uint *)_Var10._M_current + 1;
              uVar5 = *puVar14;
            } while ((uint)piVar6[(int)uVar5] < uVar3);
          } while (((uint)piVar6[(int)uVar5] <= uVar3) &&
                  (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                   (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) < uVar9));
          puVar7 = puVar15 + -1;
          do {
            puVar15 = puVar7;
            uVar5 = *puVar15;
            if ((uint)piVar6[(int)uVar5] < uVar3) break;
            puVar7 = puVar15 + -1;
          } while ((uVar3 < (uint)piVar6[(int)uVar5]) ||
                  (uVar9 <= ((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                            (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)));
        } while (puVar14 < puVar15);
      }
      *begin._M_current = *_Var10._M_current;
      *_Var10._M_current = uVar2;
      uVar9 = (long)_Var10._M_current - (long)begin._M_current >> 2;
      puVar14 = (uint *)(_Var10._M_current + 1);
      uVar19 = (long)end._M_current - (long)puVar14 >> 2;
      if (((long)uVar9 < (long)(uVar18 >> 3)) || ((long)uVar19 < (long)(uVar18 >> 3))) {
        bad_allowed = bad_allowed + -1;
        if (bad_allowed == 0) {
          lVar13 = (long)((uVar18 - ((long)(uVar18 - 2) >> 0x3f)) + -2) >> 1;
          do {
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0>>
                      (begin,lVar13,uVar18,begin._M_current[lVar13],
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsObjectiveFunction_cpp:106:13)>
                        )comp.this);
            bVar20 = lVar13 != 0;
            lVar13 = lVar13 + -1;
          } while (bVar20);
          bVar20 = true;
          puVar12 = puVar1;
          if (4 < lVar8) {
            do {
              uVar2 = *puVar12;
              *puVar12 = *begin._M_current;
              lVar8 = lVar8 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0>>
                        (begin,0,lVar8 >> 2,uVar2,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsObjectiveFunction_cpp:106:13)>
                          )comp.this);
              puVar12 = puVar12 + -1;
            } while (4 < lVar8);
            bad_allowed = 0;
            goto LAB_002d4fdf;
          }
          bad_allowed = 0;
          goto LAB_002d59ca;
        }
        if (0x17 < (long)uVar9) {
          uVar18 = uVar9 & 0xfffffffffffffffc;
          iVar4 = *begin._M_current;
          *begin._M_current = *(begin._M_current + uVar18);
          *(begin._M_current + uVar18) = iVar4;
          iVar4 = _Var10._M_current[-1];
          _Var10._M_current[-1] = *(_Var10._M_current - uVar18);
          *(_Var10._M_current - uVar18) = iVar4;
          if (0x80 < (long)uVar9) {
            uVar9 = uVar9 >> 2;
            iVar4 = begin._M_current[1];
            begin._M_current[1] = begin._M_current[uVar9 + 1];
            begin._M_current[uVar9 + 1] = iVar4;
            iVar4 = begin._M_current[2];
            begin._M_current[2] = begin._M_current[uVar9 + 2];
            begin._M_current[uVar9 + 2] = iVar4;
            iVar4 = _Var10._M_current[-2];
            _Var10._M_current[-2] = _Var10._M_current[~uVar9];
            _Var10._M_current[~uVar9] = iVar4;
            iVar4 = _Var10._M_current[-3];
            _Var10._M_current[-3] = _Var10._M_current[-2 - uVar9];
            _Var10._M_current[-2 - uVar9] = iVar4;
          }
        }
        if (0x17 < (long)uVar19) {
          iVar4 = _Var10._M_current[1];
          uVar18 = uVar19 & 0xfffffffffffffffc;
          _Var10._M_current[1] = *(uVar18 + 4 + _Var10._M_current);
          *(uVar18 + 4 + _Var10._M_current) = iVar4;
          iVar4 = end._M_current[-1];
          end._M_current[-1] = *(end._M_current - uVar18);
          *(end._M_current - uVar18) = iVar4;
          if (0x80 < (long)uVar19) {
            uVar19 = uVar19 >> 2;
            iVar4 = _Var10._M_current[2];
            _Var10._M_current[2] = _Var10._M_current[uVar19 + 2];
            _Var10._M_current[uVar19 + 2] = iVar4;
            iVar4 = _Var10._M_current[3];
            _Var10._M_current[3] = _Var10._M_current[uVar19 + 3];
            _Var10._M_current[uVar19 + 3] = iVar4;
            iVar4 = end._M_current[-2];
            end._M_current[-2] = end._M_current[~uVar19];
            end._M_current[~uVar19] = iVar4;
            iVar4 = end._M_current[-3];
            end._M_current[-3] = end._M_current[-2 - uVar19];
            end._M_current[-2 - uVar19] = iVar4;
          }
        }
      }
      else if (puVar17 <= puVar12) {
        if (begin._M_current == _Var10._M_current) {
LAB_002d5726:
          bVar20 = true;
          if (puVar14 == (uint *)end._M_current) goto LAB_002d59ca;
          lVar8 = 4;
          lVar13 = 0;
          uVar18 = 0;
          do {
            puVar12 = (uint *)((long)_Var10._M_current + lVar8 + 4);
            if (puVar12 == (uint *)end._M_current) goto LAB_002d4fdf;
            puVar17 = (uint *)((long)_Var10._M_current + lVar8);
            uVar2 = *puVar12;
            uVar9 = (ulong)uVar2;
            uVar3 = *puVar17;
            if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
               (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
                ((uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
                 ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
              *puVar12 = uVar3;
              if (lVar8 != 4) {
                lVar16 = lVar13;
                do {
                  uVar3 = *(uint *)((long)_Var10._M_current + lVar16);
                  if (((uint)piVar6[(int)uVar3] <= (uint)piVar6[(int)uVar2]) &&
                     (((uint)piVar6[(int)uVar3] < (uint)piVar6[(int)uVar2] ||
                      (((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <=
                       (uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) break;
                  *(uint *)((long)puVar14 + lVar16) = uVar3;
                  lVar16 = lVar16 + -4;
                } while (lVar16 != 0);
                puVar17 = (uint *)(lVar16 + (long)puVar14);
              }
              *puVar17 = uVar2;
              uVar18 = uVar18 + ((long)puVar12 - (long)puVar17 >> 2);
            }
            lVar8 = lVar8 + 4;
            lVar13 = lVar13 + 4;
          } while (uVar18 < 9);
        }
        else {
          lVar8 = 0;
          uVar18 = 0;
          _Var11._M_current = begin._M_current;
          do {
            puVar12 = (uint *)_Var11._M_current + 1;
            if (puVar12 == (uint *)_Var10._M_current) goto LAB_002d5726;
            uVar2 = ((uint *)_Var11._M_current)[1];
            uVar9 = (ulong)uVar2;
            uVar3 = *_Var11._M_current;
            if (((uint)piVar6[(int)uVar2] < (uint)piVar6[(int)uVar3]) ||
               (((uint)piVar6[(int)uVar2] <= (uint)piVar6[(int)uVar3] &&
                ((uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
                 ((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
              ((uint *)_Var11._M_current)[1] = uVar3;
              if (_Var11._M_current != begin._M_current) {
                lVar13 = 0;
                do {
                  uVar3 = *(uint *)((long)_Var11._M_current + lVar13 + -4);
                  if (((uint)piVar6[(int)uVar3] <= (uint)piVar6[(int)uVar2]) &&
                     (((uint)piVar6[(int)uVar3] < (uint)piVar6[(int)uVar2] ||
                      (((ulong)uVar3 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       (ulong)uVar3 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <=
                       (uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) break;
                  *(uint *)((long)_Var11._M_current + lVar13) = uVar3;
                  lVar13 = lVar13 + -4;
                } while (lVar8 != lVar13);
                _Var11._M_current = _Var11._M_current + lVar13;
              }
              *_Var11._M_current = uVar2;
              uVar18 = uVar18 + ((long)puVar12 - (long)_Var11._M_current >> 2);
            }
            lVar8 = lVar8 + -4;
            _Var11._M_current = (int *)puVar12;
          } while (uVar18 < 9);
        }
      }
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0,false>
                (begin,_Var10,comp,bad_allowed,(bool)(leftmost & 1));
      bVar20 = false;
      leftmost = false;
      begin._M_current = (int *)puVar14;
    }
LAB_002d59ca:
    if (bVar20) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }